

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

bcf_hdr_t * bcf_hdr_read(htsFile *hfp)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bcf_hdr_t *hdr;
  ssize_t sVar5;
  char *pcVar6;
  kstream_t *ks;
  size_t sVar7;
  undefined1 *puVar8;
  kstring_t *pkVar9;
  ulong uVar10;
  byte *pbVar11;
  size_t sVar12;
  kstring_t *pkVar13;
  htsFile *tbx;
  char **__ptr;
  bcf_hrec_t *pbVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  BGZF *pBVar18;
  kstring_t *htxt;
  undefined8 unaff_RBX;
  int64_t *piVar19;
  uchar *puVar20;
  undefined8 unaff_R12;
  undefined1 *__size;
  int64_t *piVar21;
  uint8_t magic [5];
  int hlen;
  bcf_hdr_t *pbStack_90;
  int iStack_84;
  htsFile *phStack_80;
  kstring_t *pkStack_78;
  BGZF *pBStack_70;
  kstring_t kStack_68;
  byte abStack_49 [9];
  undefined8 uStack_40;
  undefined7 uStack_30;
  undefined1 local_29;
  undefined1 uStack_28;
  char cStack_27;
  undefined1 uStack_26;
  char local_25;
  int local_24;
  
  if ((hfp->format).format != vcf) {
    pBVar18 = (hfp->fp).bgzf;
    uStack_40 = 0x119976;
    hdr = bcf_hdr_init("r");
    uStack_40 = 0x11998b;
    sVar5 = bgzf_read(pBVar18,&local_29,5);
    if (sVar5 < 0) {
      uStack_40 = 0x119a30;
      bcf_hdr_read_cold_3();
    }
    else {
      if (local_25 == '\x02' &&
          CONCAT13(uStack_26,CONCAT12(cStack_27,CONCAT11(uStack_28,local_29))) == 0x2464342) {
        uStack_40 = 0x1199ed;
        bgzf_read(pBVar18,&local_24,4);
        uStack_40 = 0x1199f8;
        pcVar6 = (char *)malloc((long)local_24);
        uStack_40 = 0x119a09;
        bgzf_read(pBVar18,pcVar6,(long)local_24);
        uStack_40 = 0x119a14;
        bcf_hdr_parse(hdr,pcVar6);
        uStack_40 = 0x119a1c;
        free(pcVar6);
        return hdr;
      }
      if (cStack_27 == 'F' && CONCAT11(uStack_28,local_29) == 0x4342) {
        uStack_40 = 0x119a37;
        bcf_hdr_read_cold_2();
      }
      else if (1 < hts_verbose) {
        uStack_40 = 0x119a3e;
        bcf_hdr_read_cold_1();
      }
      uStack_40 = 0x1199d4;
      bcf_hdr_destroy(hdr);
    }
    return (bcf_hdr_t *)0x0;
  }
  uStack_28 = (undefined1)unaff_R12;
  cStack_27 = (char)((ulong)unaff_R12 >> 8);
  uStack_26 = (undefined1)((ulong)unaff_R12 >> 0x10);
  local_25 = (char)((ulong)unaff_R12 >> 0x18);
  local_24 = (int)((ulong)unaff_R12 >> 0x20);
  uStack_30 = (undefined7)unaff_RBX;
  local_29 = (undefined1)((ulong)unaff_RBX >> 0x38);
  pkVar9 = &hfp->line;
  pbStack_90 = bcf_hdr_init("r");
  htxt = (kstring_t *)0x0;
  __size = (undefined1 *)0x0;
  piVar19 = (int64_t *)0x0;
  pkStack_78 = pkVar9;
  do {
    do {
      iVar3 = hts_getline(hfp,2,pkVar9);
      if (iVar3 < 0) goto LAB_00119f7a;
      sVar12 = pkVar9->l;
    } while (sVar12 == 0);
    pcVar6 = (hfp->line).s;
    phStack_80 = hfp;
    if (*pcVar6 != '#') {
      if (1 < hts_verbose) {
        vcf_hdr_read_cold_1();
      }
      free(htxt);
      bcf_hdr_destroy(pbStack_90);
      goto LAB_0011a0ea;
    }
    if ((pcVar6[1] != '#') && (hfp->fn_aux != (char *)0x0)) {
      kStack_68.l = 0;
      kStack_68.m = 0;
      kStack_68.s = (char *)0x0;
      pBStack_70 = (BGZF *)gzopen();
      ks = ks_init(pBStack_70);
LAB_00119af1:
      iVar3 = ks_getuntil2(ks,0,&kStack_68,&iStack_84,0);
      if (-1 < iVar3) {
        puVar8 = (undefined1 *)((long)piVar19 + 0xe);
        pkVar9 = htxt;
        if (puVar8 < __size) {
LAB_00119b5f:
          *(undefined8 *)((long)&pkVar9->l + (long)((long)piVar19 + 5)) = 0x3d44493c3d676974;
          *(undefined8 *)((long)&pkVar9->l + (long)piVar19) = 0x6769746e6f632323;
          *(undefined1 *)((long)&pkVar9->m + (long)((long)piVar19 + 5)) = 0;
          piVar19 = (int64_t *)((long)piVar19 + 0xd);
          htxt = pkVar9;
        }
        else {
          uVar16 = (ulong)puVar8 >> 1 | (ulong)puVar8;
          uVar16 = uVar16 >> 2 | uVar16;
          uVar16 = uVar16 >> 4 | uVar16;
          uVar16 = uVar16 >> 8 | uVar16;
          __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
          pkVar9 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar9 != (kstring_t *)0x0) goto LAB_00119b5f;
        }
        pcVar6 = kStack_68.s;
        sVar7 = strlen(kStack_68.s);
        sVar7 = (size_t)(int)sVar7;
        puVar8 = (undefined1 *)((long)piVar19 + sVar7 + 1);
        pkVar9 = htxt;
        if (puVar8 < __size) {
LAB_00119bf2:
          htxt = pkVar9;
          memcpy((void *)((long)&htxt->l + (long)piVar19),pcVar6,sVar7);
          *(undefined1 *)((long)&htxt->l + (long)(sVar7 + (long)piVar19)) = 0;
          piVar19 = (int64_t *)(sVar7 + (long)piVar19);
        }
        else {
          uVar16 = (ulong)puVar8 >> 1 | (ulong)puVar8;
          uVar16 = uVar16 >> 2 | uVar16;
          uVar16 = uVar16 >> 4 | uVar16;
          uVar16 = uVar16 >> 8 | uVar16;
          __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
          pkVar9 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar9 != (kstring_t *)0x0) goto LAB_00119bf2;
        }
        ks_getuntil2(ks,0,&kStack_68,&iStack_84,0);
        puVar8 = (undefined1 *)((long)piVar19 + 9);
        pkVar9 = htxt;
        if (puVar8 < __size) {
LAB_00119c7e:
          *(undefined8 *)((long)&pkVar9->l + (long)piVar19) = 0x3d6874676e656c2c;
          *(undefined1 *)((long)&pkVar9->m + (long)piVar19) = 0;
          piVar19 = piVar19 + 1;
          htxt = pkVar9;
        }
        else {
          uVar16 = (ulong)puVar8 >> 1 | (ulong)puVar8;
          uVar16 = uVar16 >> 2 | uVar16;
          uVar16 = uVar16 >> 4 | uVar16;
          uVar16 = uVar16 >> 8 | uVar16;
          __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
          pkVar9 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar9 != (kstring_t *)0x0) goto LAB_00119c7e;
        }
        uVar10 = atol(kStack_68.s);
        iVar3 = (int)uVar10;
        uVar16 = (ulong)(uint)-iVar3;
        if (0 < iVar3) {
          uVar16 = uVar10 & 0xffffffff;
        }
        uVar10 = 0;
        do {
          uVar15 = (uint)uVar16;
          abStack_49[uVar10 + 1] = (char)uVar16 + (char)(uVar16 / 10) * -10 | 0x30;
          uVar10 = uVar10 + 1;
          uVar16 = uVar16 / 10;
        } while (9 < uVar15);
        if (iVar3 < 0) {
          uVar16 = uVar10 & 0xffffffff;
          uVar10 = (ulong)((int)uVar10 + 1);
          abStack_49[uVar16 + 1] = 0x2d;
        }
        puVar8 = (undefined1 *)((long)piVar19 + (long)(int)uVar10 + 1);
        pkVar9 = htxt;
        if (puVar8 < __size) {
LAB_00119d40:
          htxt = pkVar9;
          pbVar11 = abStack_49 + (uVar10 & 0xffffffff);
          iVar3 = (int)uVar10 + 1;
          do {
            *(byte *)((long)&htxt->l + (long)piVar19) = *pbVar11;
            piVar19 = (int64_t *)((long)piVar19 + 1);
            iVar3 = iVar3 + -1;
            pbVar11 = pbVar11 + -1;
          } while (1 < iVar3);
          *(undefined1 *)((long)&htxt->l + (long)piVar19) = 0;
        }
        else {
          uVar16 = (ulong)puVar8 >> 1 | (ulong)puVar8;
          uVar16 = uVar16 >> 2 | uVar16;
          uVar16 = uVar16 >> 4 | uVar16;
          uVar16 = uVar16 >> 8 | uVar16;
          __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
          pkVar9 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar9 != (kstring_t *)0x0) goto LAB_00119d40;
        }
        piVar1 = (int *)((long)piVar19 + 3);
        pkVar9 = htxt;
        if (piVar1 < __size) {
LAB_00119dbd:
          htxt = pkVar9;
          *(undefined2 *)((long)&htxt->l + (long)piVar19) = 0xa3e;
          *(undefined1 *)((long)&htxt->l + (long)((long)piVar19 + 2)) = 0;
          piVar19 = (int64_t *)((long)piVar19 + 2);
        }
        else {
          uVar16 = (ulong)piVar1 >> 1 | (ulong)piVar1;
          uVar16 = uVar16 >> 2 | uVar16;
          uVar16 = uVar16 >> 4 | uVar16;
          uVar16 = uVar16 >> 8 | uVar16;
          __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
          pkVar9 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar9 != (kstring_t *)0x0) goto LAB_00119dbd;
        }
        pkVar9 = pkStack_78;
        if (iStack_84 != 10) {
          iVar3 = ks->begin;
          iVar4 = ks->end;
          do {
            if (((*(uint *)&ks->field_0x8 & 3) != 0) && (iVar4 <= iVar3)) break;
            puVar20 = ks->buf;
            if (iVar4 <= iVar3) {
              ks->begin = 0;
              iVar4 = gzread(ks->f,puVar20,(int)*(uint *)&ks->field_0x8 >> 2);
              ks->end = iVar4;
              if (iVar4 == 0) {
                *(uint *)&ks->field_0x8 = (*(uint *)&ks->field_0x8 & 0xfffffffc) + 1;
                break;
              }
              iVar3 = ks->begin;
              puVar20 = ks->buf;
            }
            ks->seek_pos = ks->seek_pos + 1;
            lVar17 = (long)iVar3;
            iVar3 = iVar3 + 1;
            ks->begin = iVar3;
          } while (puVar20[lVar17] != '\n');
        }
        goto LAB_00119af1;
      }
      free(kStack_68.s);
      ks_destroy(ks);
      gzclose(pBStack_70);
      sVar12 = (phStack_80->line).l;
      pcVar6 = (phStack_80->line).s;
    }
    pBVar18 = (BGZF *)(long)(int)sVar12;
    piVar21 = (int64_t *)(&pBVar18->field_0x1 + (long)piVar19);
    pkVar13 = htxt;
    if (piVar21 < __size) {
LAB_00119eda:
      htxt = pkVar13;
      memcpy((void *)((long)&htxt->l + (long)piVar19),pcVar6,(size_t)pBVar18);
      *(undefined1 *)((long)&htxt->l + (long)(&pBVar18->field_0x0 + (long)piVar19)) = 0;
      piVar19 = (int64_t *)(&pBVar18->field_0x0 + (long)piVar19);
      pkVar9 = pkStack_78;
    }
    else {
      uVar16 = (ulong)piVar21 >> 1 | (ulong)piVar21;
      uVar16 = uVar16 >> 2 | uVar16;
      uVar16 = uVar16 >> 4 | uVar16;
      uVar16 = uVar16 >> 8 | uVar16;
      __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
      pBStack_70 = pBVar18;
      pkVar13 = (kstring_t *)realloc(htxt,(size_t)__size);
      pBVar18 = pBStack_70;
      if (pkVar13 != (kstring_t *)0x0) goto LAB_00119eda;
      piVar21 = (int64_t *)((long)piVar19 + 1);
    }
    hfp = phStack_80;
    pkVar13 = htxt;
    if (piVar21 < __size) {
LAB_00119f52:
      *(undefined1 *)((long)&pkVar13->l + (long)piVar19) = 10;
      *(undefined1 *)((long)&pkVar13->l + (long)piVar21) = 0;
      piVar19 = piVar21;
      htxt = pkVar13;
    }
    else {
      uVar16 = (ulong)piVar21 >> 1 | (ulong)piVar21;
      uVar16 = uVar16 >> 2 | uVar16;
      uVar16 = uVar16 >> 4 | uVar16;
      uVar16 = uVar16 >> 8 | uVar16;
      __size = (undefined1 *)((uVar16 >> 0x10 | uVar16) + 1);
      pkVar13 = (kstring_t *)realloc(htxt,(size_t)__size);
      if (pkVar13 != (kstring_t *)0x0) goto LAB_00119f52;
    }
  } while ((hfp->line).s[1] == '#');
LAB_00119f7a:
  if (htxt == (kstring_t *)0x0) {
    vcf_hdr_read_cold_2();
LAB_0011a0ea:
    pbStack_90 = (bcf_hdr_t *)0x0;
  }
  else {
    bcf_hdr_parse(pbStack_90,(char *)htxt);
    tbx = (htsFile *)tbx_index_load(hfp->fn);
    if (tbx != (htsFile *)0x0) {
      __ptr = tbx_seqnames((tbx_t *)tbx,(int *)&kStack_68);
      if ((int)kStack_68.l < 1) {
        free(__ptr);
        tbx_destroy((tbx_t *)tbx);
      }
      else {
        lVar17 = 0;
        bVar2 = false;
        iVar3 = (int)kStack_68.l;
        phStack_80 = tbx;
        pkStack_78 = htxt;
        do {
          pbVar14 = bcf_hdr_get_hrec(pbStack_90,3,"ID",__ptr[lVar17],(char *)0x0);
          if (pbVar14 == (bcf_hrec_t *)0x0) {
            pbVar14 = (bcf_hrec_t *)calloc(1,0x30);
            pcVar6 = strdup("contig");
            pbVar14->key = pcVar6;
            bcf_hrec_add_key(pbVar14,"ID",2);
            iVar3 = pbVar14->nkeys;
            pcVar6 = __ptr[lVar17];
            sVar7 = strlen(pcVar6);
            bcf_hrec_set_val(pbVar14,iVar3 + -1,pcVar6,(int)sVar7,0);
            bcf_hdr_add_hrec(pbStack_90,pbVar14);
            bVar2 = true;
            iVar3 = (int)kStack_68.l;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar3);
        free(__ptr);
        tbx_destroy((tbx_t *)phStack_80);
        htxt = pkStack_78;
        if (bVar2) {
          bcf_hdr_sync(pbStack_90);
        }
      }
    }
    free(htxt);
  }
  return pbStack_90;
}

Assistant:

bcf_hdr_t *bcf_hdr_read(htsFile *hfp)
{
    if (hfp->format.format == vcf)
        return vcf_hdr_read(hfp);

    BGZF *fp = hfp->fp.bgzf;
    uint8_t magic[5];
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    if ( bgzf_read(fp, magic, 5)<0 )
    {
        fprintf(stderr,"[%s:%d %s] Failed to read the header (reading BCF in text mode?)\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    if (strncmp((char*)magic, "BCF\2\2", 5) != 0)
    {
        if (!strncmp((char*)magic, "BCF", 3))
            fprintf(stderr,"[%s:%d %s] invalid BCF2 magic string: only BCFv2.2 is supported.\n", __FILE__,__LINE__,__FUNCTION__);
        else if (hts_verbose >= 2)
            fprintf(stderr, "[E::%s] invalid BCF2 magic string\n", __func__);
        bcf_hdr_destroy(h);
        return 0;
    }
    int hlen;
    char *htxt;
    bgzf_read(fp, &hlen, 4);
    htxt = (char*)malloc(hlen);
    bgzf_read(fp, htxt, hlen);
    bcf_hdr_parse(h, htxt);
    free(htxt);
    return h;
}